

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O0

void tcache_cleanup(tsd_t *tsd)

{
  long in_RDI;
  tcache_t *tcache;
  uint8_t state;
  uint8_t state_1;
  _Bool in_stack_00000097;
  tcache_t *in_stack_00000098;
  tsd_t *in_stack_000000a0;
  
  if ((*(byte *)(in_RDI + 1) & 1) != 0) {
    tcache_destroy(in_stack_000000a0,in_stack_00000098,in_stack_00000097);
  }
  return;
}

Assistant:

void
tcache_cleanup(tsd_t *tsd) {
	tcache_t *tcache = tsd_tcachep_get(tsd);
	if (!tcache_available(tsd)) {
		assert(tsd_tcache_enabled_get(tsd) == false);
		if (config_debug) {
			assert(tcache_small_bin_get(tcache, 0)->avail == NULL);
		}
		return;
	}
	assert(tsd_tcache_enabled_get(tsd));
	assert(tcache_small_bin_get(tcache, 0)->avail != NULL);

	tcache_destroy(tsd, tcache, true);
	if (config_debug) {
		tcache_small_bin_get(tcache, 0)->avail = NULL;
	}
}